

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

uint deqp::gles31::Functional::anon_unknown_0::swizzleColorChannel<unsigned_int>
               (Vector<unsigned_int,_4> *src,TextureSwizzleComponent swizzle)

{
  uint *puVar1;
  TextureSwizzleComponent swizzle_local;
  Vector<unsigned_int,_4> *src_local;
  
  switch(swizzle) {
  case TEXTURESWIZZLECOMPONENT_R:
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](src,0);
    src_local._4_4_ = *puVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_G:
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](src,1);
    src_local._4_4_ = *puVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_B:
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](src,2);
    src_local._4_4_ = *puVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_A:
    puVar1 = tcu::Vector<unsigned_int,_4>::operator[](src,3);
    src_local._4_4_ = *puVar1;
    break;
  case TEXTURESWIZZLECOMPONENT_ZERO:
    src_local._4_4_ = 0;
    break;
  case TEXTURESWIZZLECOMPONENT_ONE:
    src_local._4_4_ = 1;
    break;
  default:
    src_local._4_4_ = 0xffffffff;
  }
  return src_local._4_4_;
}

Assistant:

static inline T swizzleColorChannel (const tcu::Vector<T, 4>& src, TextureSwizzleComponent swizzle)
{
	switch (swizzle)
	{
		case TEXTURESWIZZLECOMPONENT_R:		return src[0];
		case TEXTURESWIZZLECOMPONENT_G:		return src[1];
		case TEXTURESWIZZLECOMPONENT_B:		return src[2];
		case TEXTURESWIZZLECOMPONENT_A:		return src[3];
		case TEXTURESWIZZLECOMPONENT_ZERO:	return (T)0;
		case TEXTURESWIZZLECOMPONENT_ONE:	return (T)1;
		default: DE_ASSERT(false); return (T)-1;
	}
}